

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
          (string *__return_storage_ptr__,void *this,Vector<unsigned_int,_4> *v)

{
  ostream *poVar1;
  bool *pbVar2;
  int i;
  long lVar3;
  ostringstream s;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  std::operator<<(&oStack_1a8,"[");
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&oStack_1a8);
    pbVar2 = (bool *)0x19002bd;
    if (lVar3 == 3) {
      pbVar2 = glcts::fixed_sample_locations_values + 1;
    }
    std::operator<<(poVar1,pbVar2);
  }
  std::operator<<(&oStack_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T v)
	{
		std::ostringstream s;
		s << "[";
		for (int i = 0; i < 4; ++i)
			s << v[i] << (i == 3 ? "" : ",");
		s << "]";
		return s.str();
	}